

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O0

void Abc_NtkDontCareFree(Odc_Man_t *p)

{
  Odc_Man_t *p_local;
  
  if (p->fVerbose != 0) {
    printf("Wins = %5d. Empty = %5d. SimsEmpty = %5d. QuantOver = %5d. WinsFinish = %5d.\n",
           (ulong)(uint)p->nWins,(ulong)(uint)p->nWinsEmpty,(ulong)(uint)p->nSimsEmpty,
           (ulong)(uint)p->nQuantsOver,(ulong)(uint)p->nWinsFinish);
    printf("Ave DCs per window = %6.2f %%. Ave DCs per finished window = %6.2f %%.\n",
           ((double)p->nTotalDcs * 1.0) / (double)p->nWins,
           ((double)p->nTotalDcs * 1.0) / (double)p->nWinsFinish);
    printf("Runtime stats of the ODC manager:\n");
    Abc_Print(1,"%s =","Cleaning    ");
    Abc_Print(1,"%9.2f sec\n",((double)p->timeClean * 1.0) / 1000000.0);
    Abc_Print(1,"%s =","Windowing   ");
    Abc_Print(1,"%9.2f sec\n",((double)p->timeWin * 1.0) / 1000000.0);
    Abc_Print(1,"%s =","Miter       ");
    Abc_Print(1,"%9.2f sec\n",((double)p->timeMiter * 1.0) / 1000000.0);
    Abc_Print(1,"%s =","Simulation  ");
    Abc_Print(1,"%9.2f sec\n",((double)p->timeSim * 1.0) / 1000000.0);
    Abc_Print(1,"%s =","Quantifying ");
    Abc_Print(1,"%9.2f sec\n",((double)p->timeQuant * 1.0) / 1000000.0);
    Abc_Print(1,"%s =","Truth table ");
    Abc_Print(1,"%9.2f sec\n",((double)p->timeTruth * 1.0) / 1000000.0);
    Abc_Print(1,"%s =","TOTAL       ");
    Abc_Print(1,"%9.2f sec\n",((double)p->timeTotal * 1.0) / 1000000.0);
    Abc_Print(1,"%s =","Aborted     ");
    Abc_Print(1,"%9.2f sec\n",((double)p->timeAbort * 1.0) / 1000000.0);
  }
  Vec_PtrFree(p->vRoots);
  Vec_PtrFree(p->vBranches);
  Vec_PtrFree(p->vTruths);
  Vec_PtrFree(p->vTruthsElem);
  Vec_IntFree(p->vUsedSpots);
  if (p->pObjs != (Odc_Obj_t *)0x0) {
    free(p->pObjs);
    p->pObjs = (Odc_Obj_t *)0x0;
  }
  if (p->pTable != (Odc_Lit_t *)0x0) {
    free(p->pTable);
    p->pTable = (Odc_Lit_t *)0x0;
  }
  if (p != (Odc_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Abc_NtkDontCareFree( Odc_Man_t * p )
{
    if ( p->fVerbose )
    {
        printf( "Wins = %5d. Empty = %5d. SimsEmpty = %5d. QuantOver = %5d. WinsFinish = %5d.\n", 
            p->nWins, p->nWinsEmpty, p->nSimsEmpty, p->nQuantsOver, p->nWinsFinish );
        printf( "Ave DCs per window = %6.2f %%. Ave DCs per finished window = %6.2f %%.\n", 
            1.0*p->nTotalDcs/p->nWins, 1.0*p->nTotalDcs/p->nWinsFinish );
        printf( "Runtime stats of the ODC manager:\n" );
        ABC_PRT( "Cleaning    ", p->timeClean );
        ABC_PRT( "Windowing   ", p->timeWin   );
        ABC_PRT( "Miter       ", p->timeMiter );
        ABC_PRT( "Simulation  ", p->timeSim   );
        ABC_PRT( "Quantifying ", p->timeQuant );
        ABC_PRT( "Truth table ", p->timeTruth );
        ABC_PRT( "TOTAL       ", p->timeTotal );
        ABC_PRT( "Aborted     ", p->timeAbort );
    }
    Vec_PtrFree( p->vRoots );
    Vec_PtrFree( p->vBranches );
    Vec_PtrFree( p->vTruths );
    Vec_PtrFree( p->vTruthsElem );
    Vec_IntFree( p->vUsedSpots );
    ABC_FREE( p->pObjs );
    ABC_FREE( p->pTable );
    ABC_FREE( p );
}